

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

SmodelsOutput * __thiscall
Potassco::SmodelsOutput::add(SmodelsOutput *this,Weight_t bnd,WeightLitSpan *lits,bool card)

{
  size_t sVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  WeightLit_t *pWVar7;
  Weight_t *pWVar8;
  int iVar9;
  
  sVar1 = lits->size;
  if (sVar1 == 0) {
    iVar5 = 0;
  }
  else {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar6 = *(int *)((long)&lits->first->lit + lVar4);
      iVar9 = -iVar6;
      if (-1 < *(int *)((long)&lits->first->weight + lVar4)) {
        iVar9 = iVar6;
      }
      iVar5 = iVar5 - (iVar9 >> 0x1f);
      lVar4 = lVar4 + 8;
    } while (sVar1 * 8 - lVar4 != 0);
  }
  poVar2 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if (card) {
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else {
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = this->os_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  poVar2 = this->os_;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = this->os_;
  iVar6 = (int)sVar1 - iVar5;
  if (iVar5 != 0) {
    pWVar7 = lits->first;
    iVar9 = iVar5;
    do {
      iVar3 = -pWVar7->lit;
      if (-1 < pWVar7->weight) {
        iVar3 = pWVar7->lit;
      }
      if (iVar3 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        iVar9 = iVar9 + -1;
      }
      pWVar7 = pWVar7 + 1;
    } while (iVar9 != 0);
  }
  if (iVar6 != 0) {
    pWVar7 = lits->first;
    iVar9 = iVar6;
    do {
      iVar3 = -pWVar7->lit;
      if (-1 < pWVar7->weight) {
        iVar3 = pWVar7->lit;
      }
      if (-1 < iVar3) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        iVar9 = iVar9 + -1;
      }
      pWVar7 = pWVar7 + 1;
    } while (iVar9 != 0);
  }
  if (!card) {
    poVar2 = this->os_;
    if (iVar5 != 0) {
      pWVar8 = &lits->first->weight;
      do {
        iVar9 = -((WeightLit_t *)(pWVar8 + -1))->lit;
        if (-1 < *pWVar8) {
          iVar9 = ((WeightLit_t *)(pWVar8 + -1))->lit;
        }
        if (iVar9 < 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          iVar5 = iVar5 + -1;
        }
        pWVar8 = pWVar8 + 2;
      } while (iVar5 != 0);
    }
    if (iVar6 != 0) {
      pWVar8 = &lits->first->weight;
      do {
        iVar5 = -((WeightLit_t *)(pWVar8 + -1))->lit;
        if (-1 < *pWVar8) {
          iVar5 = ((WeightLit_t *)(pWVar8 + -1))->lit;
        }
        if (-1 < iVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          iVar6 = iVar6 + -1;
        }
        pWVar8 = pWVar8 + 2;
      } while (iVar6 != 0);
    }
  }
  return this;
}

Assistant:

SmodelsOutput& SmodelsOutput::add(Weight_t bnd, const WeightLitSpan& lits, bool card) {
	unsigned neg = negSize(lits), size = static_cast<unsigned>(Potassco::size(lits));
	if (!card) { add(static_cast<unsigned>(bnd)); }
	add(size).add(neg);
	if (card)  { add(static_cast<unsigned>(bnd)); }
	print(os_, lits, neg, size - neg, Atom());
	if (!card) { print(os_, lits, neg, size - neg, SmWeight()); }
	return *this;
}